

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

void __thiscall
double_conversion::DoubleToStringConverter::CreateDecimalRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int decimal_point,
          int digits_after_point,StringBuilder *result_builder)

{
  uint uVar1;
  long lVar2;
  char *__dest;
  int iVar3;
  
  if (decimal_point < 1) {
    iVar3 = result_builder->position_;
    result_builder->position_ = iVar3 + 1;
    (result_builder->buffer_).start_[iVar3] = '0';
    if (0 < digits_after_point) {
      iVar3 = result_builder->position_;
      result_builder->position_ = iVar3 + 1;
      (result_builder->buffer_).start_[iVar3] = '.';
      StringBuilder::AddPadding(result_builder,'0',-decimal_point);
      memmove((result_builder->buffer_).start_ + result_builder->position_,decimal_digits,
              (long)length);
      result_builder->position_ = result_builder->position_ + length;
      digits_after_point = (decimal_point - length) + digits_after_point;
LAB_0057481b:
      StringBuilder::AddPadding(result_builder,'0',digits_after_point);
      return;
    }
  }
  else {
    __dest = (result_builder->buffer_).start_ + result_builder->position_;
    if (decimal_point < length) {
      memmove(__dest,decimal_digits,(ulong)(uint)decimal_point);
      lVar2 = (long)decimal_point + (long)result_builder->position_;
      result_builder->position_ = (int)lVar2 + 1;
      (result_builder->buffer_).start_[lVar2] = '.';
      iVar3 = length - decimal_point;
      memmove((result_builder->buffer_).start_ + result_builder->position_,
              decimal_digits + (uint)decimal_point,(long)iVar3);
      result_builder->position_ = result_builder->position_ + iVar3;
      StringBuilder::AddPadding(result_builder,'0',digits_after_point - iVar3);
    }
    else {
      memmove(__dest,decimal_digits,(long)length);
      result_builder->position_ = result_builder->position_ + length;
      StringBuilder::AddPadding(result_builder,'0',decimal_point - length);
      if (0 < digits_after_point) {
        iVar3 = result_builder->position_;
        result_builder->position_ = iVar3 + 1;
        (result_builder->buffer_).start_[iVar3] = '.';
        goto LAB_0057481b;
      }
    }
  }
  if (digits_after_point == 0) {
    uVar1 = this->flags_;
    if ((uVar1 & 2) != 0) {
      iVar3 = result_builder->position_;
      result_builder->position_ = iVar3 + 1;
      (result_builder->buffer_).start_[iVar3] = '.';
      uVar1 = this->flags_;
    }
    if ((uVar1 & 4) != 0) {
      iVar3 = result_builder->position_;
      result_builder->position_ = iVar3 + 1;
      (result_builder->buffer_).start_[iVar3] = '0';
    }
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateDecimalRepresentation(
    const char* decimal_digits,
    int length,
    int decimal_point,
    int digits_after_point,
    StringBuilder* result_builder) const {
  // Create a representation that is padded with zeros if needed.
  if (decimal_point <= 0) {
      // "0.00000decimal_rep" or "0.000decimal_rep00".
    result_builder->AddCharacter('0');
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', -decimal_point);
      DOUBLE_CONVERSION_ASSERT(length <= digits_after_point - (-decimal_point));
      result_builder->AddSubstring(decimal_digits, length);
      int remaining_digits = digits_after_point - (-decimal_point) - length;
      result_builder->AddPadding('0', remaining_digits);
    }
  } else if (decimal_point >= length) {
    // "decimal_rep0000.00000" or "decimal_rep.0000".
    result_builder->AddSubstring(decimal_digits, length);
    result_builder->AddPadding('0', decimal_point - length);
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', digits_after_point);
    }
  } else {
    // "decima.l_rep000".
    DOUBLE_CONVERSION_ASSERT(digits_after_point > 0);
    result_builder->AddSubstring(decimal_digits, decimal_point);
    result_builder->AddCharacter('.');
    DOUBLE_CONVERSION_ASSERT(length - decimal_point <= digits_after_point);
    result_builder->AddSubstring(&decimal_digits[decimal_point],
                                 length - decimal_point);
    int remaining_digits = digits_after_point - (length - decimal_point);
    result_builder->AddPadding('0', remaining_digits);
  }
  if (digits_after_point == 0) {
    if ((flags_ & EMIT_TRAILING_DECIMAL_POINT) != 0) {
      result_builder->AddCharacter('.');
    }
    if ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) {
      result_builder->AddCharacter('0');
    }
  }
}